

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_base64.cpp
# Opt level: O0

bool __thiscall
ON_Base64EncodeStream::In(ON_Base64EncodeStream *this,ON__UINT64 in_buffer_size,void *in_buffer)

{
  uint *puVar1;
  uint uVar2;
  ON__UINT32 OVar3;
  ON__UINT32 OVar4;
  int iVar5;
  byte local_4a;
  byte local_49;
  ON_Base64EncodeImplementation *imp;
  ON__UINT32 sz;
  ON__UINT32 crc1;
  bool rc;
  void *in_buffer_local;
  ON__UINT64 in_buffer_size_local;
  ON_Base64EncodeStream *this_local;
  
  if (in_buffer_size == 0) {
    this_local._7_1_ = true;
  }
  else if (this->m_implementation == (void *)0x0) {
    ErrorHandler(this);
    this_local._7_1_ = false;
  }
  else if (in_buffer == (void *)0x0) {
    ErrorHandler(this);
    this_local._7_1_ = false;
  }
  else {
    puVar1 = (uint *)this->m_implementation;
    _crc1 = (uchar *)in_buffer;
    in_buffer_local = (void *)in_buffer_size;
    if (*puVar1 != 0) {
      uVar2 = 0x39 - *puVar1;
      if (in_buffer_size < uVar2) {
        memcpy((void *)((long)puVar1 + (ulong)*puVar1 + 4),in_buffer,in_buffer_size & 0xffffffff);
        *puVar1 = (int)in_buffer_size + *puVar1;
        return true;
      }
      memcpy((void *)((long)puVar1 + (ulong)*puVar1 + 4),in_buffer,(ulong)uVar2);
      _crc1 = (uchar *)((long)in_buffer + (ulong)uVar2);
      in_buffer_local = (void *)(in_buffer_size - uVar2);
      EncodeBase64Helper57((uchar *)(puVar1 + 1),(char *)(puVar1 + 0x11));
      *puVar1 = 0;
      OVar3 = ON_CRC32(this->m_out_crc,0x4c,puVar1 + 0x11);
      if (this->m_out_callback_function == (ON_StreamCallbackFunction)0x0) {
        iVar5 = (*this->_vptr_ON_Base64EncodeStream[2])
                          (this,this->m_out_callback_context,0x4c,puVar1 + 0x11);
        local_49 = (byte)iVar5;
      }
      else {
        local_49 = (*this->m_out_callback_function)(this->m_out_callback_context,0x4c,puVar1 + 0x11)
        ;
      }
      if ((local_49 & 1) == 0) {
        onfree(this->m_implementation);
        this->m_implementation = (void *)0x0;
        return false;
      }
      OVar4 = ON_CRC32(this->m_in_crc,0x39,puVar1 + 1);
      this->m_in_crc = OVar4;
      this->m_in_size = this->m_in_size + 0x39;
      this->m_out_crc = OVar3;
      this->m_out_size = this->m_out_size + 0x4c;
    }
    for (; (void *)0x38 < in_buffer_local; in_buffer_local = (void *)((long)in_buffer_local + -0x39)
        ) {
      EncodeBase64Helper57(_crc1,(char *)(puVar1 + 0x11));
      OVar3 = ON_CRC32(this->m_out_crc,0x4c,puVar1 + 0x11);
      if (this->m_out_callback_function == (ON_StreamCallbackFunction)0x0) {
        iVar5 = (*this->_vptr_ON_Base64EncodeStream[2])
                          (this,this->m_out_callback_context,0x4c,puVar1 + 0x11);
        local_4a = (byte)iVar5;
      }
      else {
        local_4a = (*this->m_out_callback_function)(this->m_out_callback_context,0x4c,puVar1 + 0x11)
        ;
      }
      if ((local_4a & 1) == 0) {
        onfree(this->m_implementation);
        this->m_implementation = (void *)0x0;
        return false;
      }
      OVar4 = ON_CRC32(this->m_in_crc,0x39,_crc1);
      this->m_in_crc = OVar4;
      this->m_in_size = this->m_in_size + 0x39;
      this->m_out_crc = OVar3;
      this->m_out_size = this->m_out_size + 0x4c;
      _crc1 = _crc1 + 0x39;
    }
    if (in_buffer_local != (void *)0x0) {
      memcpy(puVar1 + 1,_crc1,(size_t)in_buffer_local);
    }
    *puVar1 = (uint)in_buffer_local;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Base64EncodeStream::In(
    ON__UINT64 in_buffer_size,
    const void* in_buffer
    )
{
  if ( in_buffer_size <= 0 )
    return true;

  if ( 0 == m_implementation )
  {
    ErrorHandler();
    return false;
  }

  if ( 0 == in_buffer )
  {
    ErrorHandler();
    return false;
  }
  
  bool rc = false;
  ON__UINT32 crc1;
  ON__UINT32 sz;

  ON_Base64EncodeImplementation* imp = (ON_Base64EncodeImplementation*)m_implementation;
  if ( imp->m_in_buffer_size > 0 )
  {
    // residual input left from the previous call to In()
    sz = 57 - imp->m_in_buffer_size;
    if ( in_buffer_size < sz )
    {
      // still don't have sizeof(imp->m_in_buffer_size) bytes of input
      sz = (ON__UINT32)in_buffer_size; // cast is safe because in_buffer_size < sizeof(imp->m_in_buffer_size) <= 8192
      memcpy( imp->m_in_buffer + imp->m_in_buffer_size, in_buffer, sz );
      imp->m_in_buffer_size += sz;
      return true;
    }

    memcpy( imp->m_in_buffer + imp->m_in_buffer_size, in_buffer, sz );
    in_buffer = ((const unsigned char*)in_buffer) + sz;
    in_buffer_size -= sz;

    EncodeBase64Helper57(imp->m_in_buffer,imp->m_out_buffer);
    imp->m_in_buffer_size = 0;

    crc1 = ON_CRC32(m_out_crc,76,imp->m_out_buffer);
    rc = ( 0 != m_out_callback_function )
        ? m_out_callback_function(m_out_callback_context,76,imp->m_out_buffer)
        : Out(m_out_callback_context,76,imp->m_out_buffer);
    if ( !rc )
    {
      onfree(m_implementation);
      m_implementation = 0;
      return false;
    }
    m_in_crc = ON_CRC32(m_in_crc,57,imp->m_in_buffer);
    m_in_size += 57;
    m_out_crc = crc1;
    m_out_size += 76;
  }

  while(in_buffer_size >= 57 )
  {
    // base 64 encode 57 input bytes to create 76 output bytes
    EncodeBase64Helper57((const unsigned char*)in_buffer,imp->m_out_buffer);
    crc1 = ON_CRC32(m_out_crc,76,imp->m_out_buffer);
    rc = ( 0 != m_out_callback_function )
        ? m_out_callback_function(m_out_callback_context,76,imp->m_out_buffer)
        : Out(m_out_callback_context,76,imp->m_out_buffer);
    if ( !rc )
    {
      onfree(m_implementation);
      m_implementation = 0;
      return false;
    }
    m_in_crc = ON_CRC32(m_in_crc,57,in_buffer);
    m_in_size += 57;
    m_out_crc = crc1;
    m_out_size += 76;
    in_buffer = ((const unsigned char*)in_buffer) + 57;
    in_buffer_size -= 57;
  }

  if ( in_buffer_size > 0 )
  {
    // store what's left of the input in imp->m_in_buffer[]
    memcpy(imp->m_in_buffer,in_buffer,(size_t)in_buffer_size);
  }
  imp->m_in_buffer_size = (ON__UINT32)in_buffer_size; // safe cast - sizeof_buffer < 57

  return true;
}